

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O2

void __thiscall
Js::ActivationObjectEx::GetPropertyCore
          (ActivationObjectEx *this,PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  FunctionBody *pFVar2;
  undefined1 local_d8 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *currentFunc;
  
  if (((info != (PropertyValueInfo *)0x0) && (this->firstFuncSlot <= (uint)info->m_propertyIndex))
     && ((uint)info->m_propertyIndex <= this->lastFuncSlot)) {
    ScriptFunction::InvalidateCachedScopeChain((this->parentFunc).ptr);
    walker.currentFrame.stackCheckCodeHeight = 0;
    JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_d8,requestContext,true,(PVOID)0x0,false);
    do {
      BVar1 = JavascriptStackWalker::GetCaller
                        ((JavascriptStackWalker *)local_d8,
                         (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
      if (BVar1 == 0) goto LAB_00c21137;
      BVar1 = JavascriptStackWalker::IsEvalCaller((JavascriptStackWalker *)local_d8);
    } while (BVar1 == 0);
    pFVar2 = JavascriptFunction::GetFunctionBody
                       ((JavascriptFunction *)walker.currentFrame.stackCheckCodeHeight);
    pFVar2->field_0x178 = pFVar2->field_0x178 | 0x20;
LAB_00c21137:
    JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_d8);
  }
  return;
}

Assistant:

void ActivationObjectEx::GetPropertyCore(PropertyValueInfo *info, ScriptContext *requestContext)
    {
        if (info)
        {
            PropertyIndex slot = info->GetPropertyIndex();
            if (slot >= this->firstFuncSlot && slot <= this->lastFuncSlot)
            {
                this->parentFunc->InvalidateCachedScopeChain();

                // If the caller is an eval, then each time we execute the eval we need to invalidate the
                // cached scope chain. We can't rely on detecting the escape each time, because inline
                // cache hits may keep us from entering the runtime. So set a flag to make sure the
                // invalidation always happens.
                JavascriptFunction *currentFunc = nullptr;
                JavascriptStackWalker walker(requestContext);
                while (walker.GetCaller(&currentFunc))
                {
                    if (walker.IsEvalCaller())
                    {
                        //We are walking the stack, so the function body must have been deserialized by this point.
                        currentFunc->GetFunctionBody()->SetFuncEscapes(true);
                        break;
                    }
                }
            }
        }
    }